

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerArgIn(Lowerer *this,Instr *instrArgIn)

{
  code *pcVar1;
  LabelInstr *pLVar2;
  bool bVar3;
  ArgSlot AVar4;
  ArgSlot AVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  IntConstOpnd *pIVar8;
  SymOpnd *pSVar9;
  Opnd *pOVar10;
  StackSym *pSVar11;
  JitArenaAllocator *pJVar12;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  RegOpnd *pRVar14;
  Lowerer *local_190;
  IntConstOpnd *formalsOpnd_1;
  ArgSlot diffSlotsNum;
  ArgSlot currParamSlotNum;
  ArgSlot prevParamSlotNum;
  TrackAllocData local_140;
  BVSparse<Memory::JitArenaAllocator> *local_118;
  BVSparse<Memory::JitArenaAllocator> *formalsBv;
  Opnd *opndUndefAddress;
  ArgSlot missingSlotNums;
  Opnd *pOStack_100;
  ArgSlot highestSlotNum;
  Opnd *excessOpnd;
  Instr *instrCount;
  ArgSlot currArgInCount;
  Instr *pIStack_e8;
  ArgSlot formalsCount;
  Instr *prev;
  IntConstOpnd *formalsOpnd;
  LabelInstr *createRestArrayLabel;
  Opnd *excessOpnd_1;
  Instr *instrCount_1;
  Instr *restInstr;
  Opnd *pOStack_b0;
  bool hasRest;
  Opnd *restDst;
  RegOpnd *generatorArgsPtrOpnd;
  StackSym *pSStack_98;
  BOOLEAN isDuplicate;
  StackSym *symParam;
  RegOpnd *pRStack_88;
  ArgSlot argIndex;
  Opnd *opndUndef;
  Opnd *srcOpnd;
  Opnd *dstOpnd;
  Instr *instrResume;
  Instr *instrPrev;
  Instr *instrInsert;
  Instr *instrArgInNext;
  BranchInstr *instrBranch;
  LabelInstr *labelInitNext;
  LabelInstr *labelInit;
  LabelInstr *labelNormal;
  LabelInstr *labelUndef;
  LabelInstr *labelDone;
  Instr *instrArgIn_local;
  Lowerer *this_local;
  
  dstOpnd = (Opnd *)0x0;
  restDst = (Opnd *)0x0;
  labelDone = (LabelInstr *)instrArgIn;
  instrArgIn_local = (Instr *)this;
  if (instrArgIn == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ce3,"(instrArgIn)","instrArgIn");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOStack_b0 = (Opnd *)0x0;
  restInstr._7_1_ = (labelDone->super_Instr).m_opcode == ArgIn_Rest;
  if ((bool)restInstr._7_1_) {
    instrCount_1 = &labelDone->super_Instr;
    pOStack_b0 = IR::Instr::UnlinkDst(&labelDone->super_Instr);
    pJVar7 = Func::GetJITFunctionBody(this->m_func);
    bVar3 = JITTimeFunctionBody::HasImplicitArgIns(pJVar7);
    if ((!bVar3) || (this->m_func->argInsCount == 0)) {
      if ((labelDone->super_Instr).m_func != this->m_func) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2cf9,"(instrArgIn->m_func == this->m_func)",
                           "instrArgIn->m_func == this->m_func");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pLVar2 = labelDone;
      AVar4 = Func::GetInParamsCount(this->m_func);
      excessOpnd_1 = (Opnd *)LowererMD::LoadInputParamCount
                                       (&this->m_lowererMD,&pLVar2->super_Instr,-(uint)AVar4,false);
      createRestArrayLabel = (LabelInstr *)IR::Instr::GetDst((Instr *)excessOpnd_1);
      formalsOpnd = (IntConstOpnd *)IR::LabelInstr::New(Label,this->m_func,false);
      pLVar2 = createRestArrayLabel;
      pIVar8 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertCompareBranch(this,(Opnd *)pLVar2,&pIVar8->super_Opnd,BrGe_A,(LabelInstr *)formalsOpnd,
                          &labelDone->super_Instr,false);
      pLVar2 = createRestArrayLabel;
      pIVar8 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertMove((Opnd *)pLVar2,&pIVar8->super_Opnd,&labelDone->super_Instr,true);
      IR::Instr::InsertBefore(&labelDone->super_Instr,(Instr *)formalsOpnd);
      pJVar7 = Func::GetJITFunctionBody(this->m_func);
      bVar3 = JITTimeFunctionBody::IsCoroutine(pJVar7);
      if (bVar3) {
        bVar3 = Func::IsLoopBody(this->m_func);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2d0a,"(!m_func->IsLoopBody())",
                             "LoopBody Jit should not involve Rest params");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        restDst = &LoadGeneratorArgsPtr(&labelDone->super_Instr)->super_Opnd;
      }
      AVar4 = Func::GetInParamsCount(this->m_func);
      prev = (Instr *)IR::IntConstOpnd::New((ulong)AVar4,TyUint32,this->m_func,false);
      pIStack_e8 = LowerRestParameter(this,(Opnd *)prev,pOStack_b0,(Opnd *)createRestArrayLabel,
                                      &labelDone->super_Instr,(RegOpnd *)restDst);
      IR::Instr::Remove(&labelDone->super_Instr);
      return pIStack_e8;
    }
    while ((labelDone->super_Instr).m_opcode != ArgIn_A) {
      labelDone = (LabelInstr *)(labelDone->super_Instr).m_prev;
      if (dstOpnd == (Opnd *)0x0) {
        dstOpnd = (Opnd *)labelDone;
      }
    }
    IR::Instr::Remove(instrCount_1);
  }
  opndUndef = IR::Instr::GetSrc1(&labelDone->super_Instr);
  pSVar9 = IR::Opnd::AsSymOpnd(opndUndef);
  pSStack_98 = Sym::AsStackSym(pSVar9->m_sym);
  symParam._6_2_ = StackSym::GetParamSlotNum(pSStack_98);
  if (symParam._6_2_ == 1) {
    pJVar7 = Func::GetJITFunctionBody(this->m_func);
    bVar3 = JITTimeFunctionBody::IsCoroutine(pJVar7);
    if ((bVar3) && (bVar3 = Func::IsLoopBody(this->m_func), !bVar3)) {
      restDst = &LoadGeneratorArgsPtr(&labelDone->super_Instr)->super_Opnd;
      ConvertArgOpndIfGeneratorFunction(this,&labelDone->super_Instr,(RegOpnd *)restDst);
    }
    LowererMD::ChangeToAssign(&labelDone->super_Instr);
    if (dstOpnd == (Opnd *)0x0) {
      local_190 = (Lowerer *)(labelDone->super_Instr).m_prev;
    }
    else {
      local_190 = (Lowerer *)dstOpnd;
    }
    this_local = local_190;
  }
  else {
    instrCount._6_2_ = Func::GetInParamsCount(this->m_func);
    if (instrCount._6_2_ < symParam._6_2_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d28,"(argIndex <= formalsCount)",
                         "Expect to see the ArgIn\'s within the range of the formals");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    instrResume = &labelDone->super_Instr;
    instrCount._4_2_ = 0;
    if (this->m_func->argInsCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d30,"(this->m_func->argInsCount > 0)","this->m_func->argInsCount > 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    while ((int)(uint)instrCount._4_2_ < (int)(this->m_func->argInsCount - 1)) {
      instrResume = instrResume->m_prev;
      if (instrResume->m_opcode == ArgIn_A) {
        opndUndef = IR::Instr::GetSrc1(instrResume);
        pSVar9 = IR::Opnd::AsSymOpnd(opndUndef);
        pSStack_98 = Sym::AsStackSym(pSVar9->m_sym);
        AVar4 = StackSym::GetParamSlotNum(pSStack_98);
        if (symParam._6_2_ <= AVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2d39,"(symParam->GetParamSlotNum() < argIndex)",
                             "ArgIn\'s not in numerical order");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        symParam._6_2_ = StackSym::GetParamSlotNum(pSStack_98);
        instrCount._4_2_ = instrCount._4_2_ + 1;
      }
      else if (dstOpnd == (Opnd *)0x0) {
        dstOpnd = (Opnd *)instrResume;
      }
    }
    instrPrev = instrResume;
    if (instrResume == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d49,"(instrInsert)","instrInsert");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (dstOpnd == (Opnd *)0x0) {
      dstOpnd = (Opnd *)instrPrev->m_prev;
    }
    pJVar7 = Func::GetJITFunctionBody(this->m_func);
    bVar3 = JITTimeFunctionBody::IsCoroutine(pJVar7);
    if (bVar3) {
      restDst = &LoadGeneratorArgsPtr(instrPrev)->super_Opnd;
    }
    excessOpnd = (Opnd *)LowererMD::LoadInputParamCount
                                   (&this->m_lowererMD,instrPrev,-(uint)instrCount._6_2_,true);
    pOStack_100 = IR::Instr::GetDst((Instr *)excessOpnd);
    labelNormal = IR::LabelInstr::New(Label,this->m_func,true);
    InsertBranch(BrLt_A,labelNormal,instrPrev);
    labelInitNext = IR::LabelInstr::New(Label,this->m_func,false);
    labelInit = labelInitNext;
    instrArgInNext = &IR::BranchInstr::New(JMP,labelInitNext,this->m_func)->super_Instr;
    IR::Instr::InsertBefore(instrPrev,instrArgInNext);
    IR::Instr::InsertBefore(instrPrev,&labelNormal->super_Instr);
    IR::Instr::InsertBefore(instrPrev,&labelInit->super_Instr);
    pOVar10 = IR::Instr::GetSrc1(&labelDone->super_Instr);
    pSVar9 = IR::Opnd::AsSymOpnd(pOVar10);
    pSVar11 = Sym::AsStackSym(pSVar9->m_sym);
    opndUndefAddress._6_2_ = StackSym::GetParamSlotNum(pSVar11);
    AVar4 = Func::GetInParamsCount(this->m_func);
    for (opndUndefAddress._4_2_ = AVar4 - opndUndefAddress._6_2_; pOVar10 = pOStack_100,
        opndUndefAddress._4_2_ != 0; opndUndefAddress._4_2_ = opndUndefAddress._4_2_ + -1) {
      pIVar8 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
      InsertAdd(true,pOVar10,pOVar10,&pIVar8->super_Opnd,&labelInit->super_Instr);
      InsertBranch(BrEq_A,labelInit,&labelInit->super_Instr);
    }
    formalsBv = (BVSparse<Memory::JitArenaAllocator> *)
                LoadLibraryValueOpnd(this,&labelInit->super_Instr,ValueUndefined);
    pRStack_88 = IR::RegOpnd::New(TyUint64,this->m_func);
    InsertMove(&pRStack_88->super_Opnd,(Opnd *)formalsBv,&labelInit->super_Instr,true);
    pJVar12 = this->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_140,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
               ,0x2d7a);
    pJVar12 = (JitArenaAllocator *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar12,&local_140);
    pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,pJVar12,0x4e98c0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar13,this->m_alloc);
    local_118 = pBVar13;
    while (instrCount._4_2_ != 0) {
      srcOpnd = IR::Instr::GetDst(&labelDone->super_Instr);
      bVar3 = IR::Opnd::IsRegOpnd(srcOpnd);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2d80,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pBVar13 = local_118;
      pRVar14 = IR::Opnd::AsRegOpnd(srcOpnd);
      pSVar11 = Sym::AsStackSym(&pRVar14->m_sym->super_Sym);
      generatorArgsPtrOpnd._7_1_ =
           BVSparse<Memory::JitArenaAllocator>::TestAndSet(pBVar13,(pSVar11->super_Sym).m_id);
      InsertMove(srcOpnd,&pRStack_88->super_Opnd,&labelInit->super_Instr,true);
      instrCount._4_2_ = instrCount._4_2_ - 1;
      instrBranch = (BranchInstr *)IR::LabelInstr::New(Label,this->m_func,false);
      IR::Instr::InsertAfter(&labelInitNext->super_Instr,(Instr *)instrBranch);
      labelInitNext = (LabelInstr *)instrBranch;
      instrInsert = (labelDone->super_Instr).m_prev;
      IR::Instr::Unlink(&labelDone->super_Instr);
      pOVar10 = IR::Instr::GetSrc1(&labelDone->super_Instr);
      pSVar9 = IR::Opnd::AsSymOpnd(pOVar10);
      pSVar11 = Sym::AsStackSym(pSVar9->m_sym);
      AVar4 = StackSym::GetParamSlotNum(pSVar11);
      if (generatorArgsPtrOpnd._7_1_ == '\0') {
        ConvertArgOpndIfGeneratorFunction(this,&labelDone->super_Instr,(RegOpnd *)restDst);
        IR::Instr::InsertBefore(&labelInitNext->super_Instr,&labelDone->super_Instr);
        LowererMD::ChangeToAssign(&labelDone->super_Instr);
      }
      else {
        IR::Instr::Free(&labelDone->super_Instr);
      }
      labelDone = (LabelInstr *)instrInsert;
      while ((labelDone->super_Instr).m_opcode != ArgIn_A) {
        labelDone = (LabelInstr *)(labelDone->super_Instr).m_prev;
        if (labelDone == (LabelInstr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2daf,"(instrArgIn)","???");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
      pOVar10 = IR::Instr::GetSrc1(&labelDone->super_Instr);
      pSVar9 = IR::Opnd::AsSymOpnd(pOVar10);
      pSVar11 = Sym::AsStackSym(pSVar9->m_sym);
      AVar5 = StackSym::GetParamSlotNum(pSVar11);
      formalsOpnd_1._2_2_ = AVar4 - AVar5;
      if (formalsOpnd_1._2_2_ == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2db6,"(diffSlotsNum > 0)","Argins are not in order?");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      for (; pOVar10 = pOStack_100, formalsOpnd_1._2_2_ != 0;
          formalsOpnd_1._2_2_ = formalsOpnd_1._2_2_ + -1) {
        pIVar8 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
        InsertAdd(true,pOVar10,pOVar10,&pIVar8->super_Opnd,&labelInit->super_Instr);
        InsertBranch(BrEq_A,(LabelInstr *)instrBranch,&labelInit->super_Instr);
      }
      pOVar10 = IR::Instr::GetSrc1(&labelDone->super_Instr);
      pSVar9 = IR::Opnd::AsSymOpnd(pOVar10);
      pSVar11 = Sym::AsStackSym(pSVar9->m_sym);
      AVar4 = StackSym::GetParamSlotNum(pSVar11);
      if (instrCount._6_2_ < AVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2dc0,
                           "(instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() <= formalsCount)"
                           ,"Expect all ArgIn\'s to be in numerical order by param slot");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    srcOpnd = IR::Instr::GetDst(&labelDone->super_Instr);
    bVar3 = IR::Opnd::IsRegOpnd(srcOpnd);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2dc9,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pBVar13 = local_118;
    pRVar14 = IR::Opnd::AsRegOpnd(srcOpnd);
    pSVar11 = Sym::AsStackSym(&pRVar14->m_sym->super_Sym);
    generatorArgsPtrOpnd._7_1_ =
         BVSparse<Memory::JitArenaAllocator>::TestAndSet(pBVar13,(pSVar11->super_Sym).m_id);
    InsertMove(srcOpnd,&pRStack_88->super_Opnd,&labelInit->super_Instr,true);
    pOVar10 = pOStack_100;
    if ((restInstr._7_1_ & 1) != 0) {
      pIVar8 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertMove(pOVar10,&pIVar8->super_Opnd,&labelInit->super_Instr,true);
    }
    labelUndef = IR::LabelInstr::New(Label,this->m_func,false);
    instrArgInNext = &IR::BranchInstr::New(JMP,labelUndef,this->m_func)->super_Instr;
    IR::Instr::InsertBefore(&labelInit->super_Instr,instrArgInNext);
    IR::Instr::InsertAfter(&labelInitNext->super_Instr,&labelUndef->super_Instr);
    if ((restInstr._7_1_ & 1) != 0) {
      AVar4 = Func::GetInParamsCount(this->m_func);
      pIVar8 = IR::IntConstOpnd::New((ulong)AVar4,TyUint32,this->m_func,false);
      LowerRestParameter(this,&pIVar8->super_Opnd,pOStack_b0,pOStack_100,&labelUndef->super_Instr,
                         (RegOpnd *)restDst);
    }
    IR::Instr::Unlink(&labelDone->super_Instr);
    if (generatorArgsPtrOpnd._7_1_ == '\0') {
      ConvertArgOpndIfGeneratorFunction(this,&labelDone->super_Instr,(RegOpnd *)restDst);
      IR::Instr::InsertBefore(&labelUndef->super_Instr,&labelDone->super_Instr);
      LowererMD::ChangeToAssign(&labelDone->super_Instr);
    }
    else {
      IR::Instr::Free(&labelDone->super_Instr);
    }
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->m_alloc,local_118);
    this_local = (Lowerer *)dstOpnd;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerArgIn(IR::Instr *instrArgIn)
{
    IR::LabelInstr *   labelDone;
    IR::LabelInstr *   labelUndef;
    IR::LabelInstr *   labelNormal;
    IR::LabelInstr *   labelInit;
    IR::LabelInstr *   labelInitNext;
    IR::BranchInstr *  instrBranch;
    IR::Instr *        instrArgInNext;
    IR::Instr *        instrInsert;
    IR::Instr *        instrPrev;
    IR::Instr *        instrResume = nullptr;
    IR::Opnd *         dstOpnd;
    IR::Opnd *         srcOpnd;
    IR::Opnd *         opndUndef;
    Js::ArgSlot        argIndex;
    StackSym *         symParam;
    BOOLEAN            isDuplicate;
    IR::RegOpnd *      generatorArgsPtrOpnd = nullptr;

    // We start with:
    // s1 = ArgIn_A param1
    // s2 = ArgIn_A param2
    // ...
    // sn = ArgIn_A paramn
    //
    // We want to end up with:
    //
    // s1 = ArgIn_A param1            -- Note that this is unconditional
    // count = (load from param area)
    //     BrLt_A $start, count, n    -- Forward cbranch to the uncommon case
    //     Br $Ln
    // $start:
    //     sn = assign undef
    //     BrGe_A $Ln-1, count, n-1
    //     sn-1 = assign undef
    // ...
    //     s2 = assign undef
    //     Br $done
    // $Ln:
    //     sn = assign paramn
    // $Ln-1:
    //     sn-1 = assign paramn-1
    // ...
    //     s2 = assign param2
    // $done:

    AnalysisAssert(instrArgIn);

    IR::Opnd *restDst = nullptr;
    bool hasRest = instrArgIn->m_opcode == Js::OpCode::ArgIn_Rest;
    if (hasRest)
    {
        IR::Instr *restInstr = instrArgIn;
        restDst = restInstr->UnlinkDst();
        if (m_func->GetJITFunctionBody()->HasImplicitArgIns() && m_func->argInsCount > 0)
        {
            while (instrArgIn->m_opcode != Js::OpCode::ArgIn_A)
            {
                instrArgIn = instrArgIn->m_prev;
                if (instrResume == nullptr)
                {
                    instrResume = instrArgIn;
                }
            }
            restInstr->Remove();
        }
        else
        {
            Assert(instrArgIn->m_func == this->m_func);
            IR::Instr * instrCount = m_lowererMD.LoadInputParamCount(instrArgIn, -this->m_func->GetInParamsCount());
            IR::Opnd * excessOpnd = instrCount->GetDst();

            IR::LabelInstr *createRestArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

            // BrGe $createRestArray, excess, 0
            InsertCompareBranch(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), Js::OpCode::BrGe_A, createRestArrayLabel, instrArgIn);

            // MOV excess, 0
            InsertMove(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), instrArgIn);

            // $createRestArray
            instrArgIn->InsertBefore(createRestArrayLabel);

            if (m_func->GetJITFunctionBody()->IsCoroutine())
            {
                AssertMsg(!m_func->IsLoopBody(), "LoopBody Jit should not involve Rest params");
                generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrArgIn);
            }

            IR::IntConstOpnd * formalsOpnd = IR::IntConstOpnd::New(this->m_func->GetInParamsCount(), TyUint32, this->m_func);
            IR::Instr *prev = LowerRestParameter(formalsOpnd, restDst, excessOpnd, instrArgIn, generatorArgsPtrOpnd);
            instrArgIn->Remove();
            return prev;
        }
    }

    srcOpnd = instrArgIn->GetSrc1();
    symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();

    argIndex = symParam->GetParamSlotNum();
    if (argIndex == 1)
    {
        // The "this" argument is not source-dependent and doesn't need to be checked.
        if (m_func->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
        {
            generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrArgIn);
            ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
        }

        m_lowererMD.ChangeToAssign(instrArgIn);
        return instrResume == nullptr ? instrArgIn->m_prev : instrResume;
    }

    Js::ArgSlot formalsCount = this->m_func->GetInParamsCount();

    AssertMsg(argIndex <= formalsCount, "Expect to see the ArgIn's within the range of the formals");

    // Because there may be instructions between the ArgIn's, such as saves to the frame object,
    // we find the top of the sequence of ArgIn's and insert everything there. This assumes that
    // ArgIn's use param symbols as src's and not the results of previous instructions.

    instrPrev = instrArgIn;
    Js::ArgSlot currArgInCount = 0;
    Assert(this->m_func->argInsCount > 0);

    while (currArgInCount < this->m_func->argInsCount - 1)
    {
        instrPrev = instrPrev->m_prev;
        if (instrPrev->m_opcode == Js::OpCode::ArgIn_A)
        {
            srcOpnd = instrPrev->GetSrc1();
            symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();
            AssertMsg(symParam->GetParamSlotNum() < argIndex, "ArgIn's not in numerical order");
            argIndex = symParam->GetParamSlotNum();
            currArgInCount++;
        }
        else
        {
            // Make sure that this instruction gets lowered.
            if (instrResume == nullptr)
            {
                instrResume = instrPrev;
            }
        }
    }
    // The loading of parameters will be inserted above this instruction.
    instrInsert = instrPrev;

    AnalysisAssert(instrInsert);
    if (instrResume == nullptr)
    {
        // We found no intervening non-ArgIn's, so lowering can resume at the previous instruction.
        instrResume = instrInsert->m_prev;
    }

    // Now insert all the checks and undef-assigns.

    if (m_func->GetJITFunctionBody()->IsCoroutine())
    {
        generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrInsert);
    }

    // excessOpnd = (load from param area) - formalCounts
    IR::Instr * instrCount = this->m_lowererMD.LoadInputParamCount(instrInsert, -formalsCount, true);
    IR::Opnd * excessOpnd = instrCount->GetDst();

    labelUndef = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, /*helperLabel*/ true);
    Lowerer::InsertBranch(Js::OpCode::BrLt_A, labelUndef, instrInsert);

    //     Br $Ln

    labelNormal = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    labelInit = labelNormal;
    instrBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelNormal, this->m_func);
    instrInsert->InsertBefore(instrBranch);

    // Insert the labels

    instrInsert->InsertBefore(labelUndef);
    instrInsert->InsertBefore(labelNormal);

    //Adjustment for deadstore of ArgIn_A
    Js::ArgSlot highestSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();
    Js::ArgSlot missingSlotNums = this->m_func->GetInParamsCount() - highestSlotNum;
    Assert(missingSlotNums >= 0);
    while (missingSlotNums > 0)
    {
        InsertAdd(true, excessOpnd, excessOpnd, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), labelNormal);
        Lowerer::InsertBranch(Js::OpCode::BrEq_A, labelNormal, labelNormal);
        missingSlotNums--;
    }

    // MOV undefReg, undefAddress
    IR::Opnd* opndUndefAddress = this->LoadLibraryValueOpnd(labelNormal, LibraryValue::ValueUndefined);
    opndUndef =  IR::RegOpnd::New(TyMachPtr, this->m_func);
    Lowerer::InsertMove(opndUndef, opndUndefAddress, labelNormal);

    BVSparse<JitArenaAllocator> *formalsBv = JitAnew(this->m_alloc, BVSparse<JitArenaAllocator>, this->m_alloc);

    while (currArgInCount > 0)
    {
        dstOpnd = instrArgIn->GetDst();

        Assert(dstOpnd->IsRegOpnd());
        isDuplicate = formalsBv->TestAndSet(dstOpnd->AsRegOpnd()->m_sym->AsStackSym()->m_id);

        // Now insert the undef initialization before the "normal" label

        //     sn = assign undef

        Lowerer::InsertMove(dstOpnd, opndUndef, labelNormal);

        //     INC excessOpnd
        //     BrEq_A $Ln-1

        currArgInCount--;

        labelInitNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

        // And insert the "normal" initialization before the "done" label

        //     sn = assign paramn
        // $Ln-1:

        labelInit->InsertAfter(labelInitNext);
        labelInit = labelInitNext;

        instrArgInNext = instrArgIn->m_prev;
        instrArgIn->Unlink();

        Js::ArgSlot prevParamSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();

        //      function foo(x, x)  { use(x); }
        // This should refer to the second 'x'.  Since we reverse the order here however, we need to skip
        // the initialization of the first 'x' to not override the one for the second.  WOOB:1105504
        if (isDuplicate)
        {
            instrArgIn->Free();
        }
        else
        {
            ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
            labelInit->InsertBefore(instrArgIn);
            this->m_lowererMD.ChangeToAssign(instrArgIn);
        }
        instrArgIn = instrArgInNext;

        while (instrArgIn->m_opcode != Js::OpCode::ArgIn_A)
        {
            instrArgIn = instrArgIn->m_prev;
            AssertMsg(instrArgIn, "???");
        }

        //Adjustment for deadstore of ArgIn_A
        Js::ArgSlot currParamSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();
        Js::ArgSlot diffSlotsNum = prevParamSlotNum - currParamSlotNum;

        AssertMsg(diffSlotsNum > 0, "Argins are not in order?");

        while (diffSlotsNum > 0)
        {
            InsertAdd(true, excessOpnd, excessOpnd, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), labelNormal);
            InsertBranch(Js::OpCode::BrEq_A, labelInitNext, labelNormal);
            diffSlotsNum--;
        }

        AssertMsg(instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() <= formalsCount,
                  "Expect all ArgIn's to be in numerical order by param slot");
    }

    // Insert final undef and normal initializations, jumping unconditionally to the end
    // rather than checking against the decremented formals count as we did inside the loop above.

    //     s2 = assign undef

    dstOpnd = instrArgIn->GetDst();
    Assert(dstOpnd->IsRegOpnd());
    isDuplicate = formalsBv->TestAndSet(dstOpnd->AsRegOpnd()->m_sym->AsStackSym()->m_id);

    Lowerer::InsertMove(dstOpnd, opndUndef, labelNormal);

    if (hasRest)
    {
        InsertMove(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), labelNormal);
    }

    //     Br $done

    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instrBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    labelNormal->InsertBefore(instrBranch);

    //     s2 = assign param2
    // $done:

    labelInit->InsertAfter(labelDone);

    if (hasRest)
    {
        // The formals count has been tainted, so restore it before lowering rest
        IR::IntConstOpnd * formalsOpnd = IR::IntConstOpnd::New(this->m_func->GetInParamsCount(), TyUint32, this->m_func);
        LowerRestParameter(formalsOpnd, restDst, excessOpnd, labelDone, generatorArgsPtrOpnd);
    }

    instrArgIn->Unlink();
    if (isDuplicate)
    {
        instrArgIn->Free();
    }
    else
    {
        ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
        labelDone->InsertBefore(instrArgIn);
        this->m_lowererMD.ChangeToAssign(instrArgIn);
    }

    JitAdelete(this->m_alloc, formalsBv);

    return instrResume;
}